

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.cpp
# Opt level: O1

Argument * __thiscall cppgenerate::Argument::operator=(Argument *this,Argument *other)

{
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->m_name);
    std::__cxx11::string::_M_assign((string *)&this->m_defaultValue);
    this->m_isConst = other->m_isConst;
    this->m_argPassType = other->m_argPassType;
  }
  return this;
}

Assistant:

Argument& Argument::operator=( const Argument& other ){
    if( this != &other ){
        m_type = other.m_type;
        m_name = other.m_name;
        m_defaultValue = other.m_defaultValue;
        m_isConst = other.m_isConst;
        m_argPassType = other.m_argPassType;
    }

    return *this;
}